

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_private.c
# Opt level: O2

void nhr_request_connect_to_host(nhr_request r)

{
  nhr_bool nVar1;
  int s;
  int iVar2;
  time_t tVar3;
  addrinfo *__ai;
  uint uVar4;
  addrinfo *paVar5;
  int iStack_50;
  
  tVar3 = time((time_t *)0x0);
  r->last_time = tVar3;
  __ai = nhr_request_connect_getaddr_info(r);
  nVar1 = nhr_request_check_timeout(r);
  if (__ai == (addrinfo *)0x0 || nVar1 == '\0') {
    return;
  }
  s = -1;
  uVar4 = 0;
LAB_00106573:
  do {
    if ((s != -1) || (3 < uVar4)) {
      freeaddrinfo((addrinfo *)__ai);
      if (r->socket == -1) {
        r->error_code = nhr_error_code_failed_connect_to_host;
        iStack_50 = 6;
      }
      else {
        iStack_50 = 2;
      }
      nhr_request_set_command(r,iStack_50);
      return;
    }
    uVar4 = uVar4 + 1;
    s = -1;
    for (paVar5 = __ai; paVar5 != (addrinfo *)0x0; paVar5 = paVar5->ai_next) {
      tVar3 = time((time_t *)0x0);
      r->last_time = tVar3;
      s = socket(paVar5->ai_family,paVar5->ai_socktype,paVar5->ai_protocol);
      if (s != -1) {
        nhr_request_set_option(s,4,1);
        nhr_request_set_option(s,9,1);
        iVar2 = connect(s,(sockaddr *)paVar5->ai_addr,paVar5->ai_addrlen);
        if (iVar2 == 0) {
          r->socket = s;
          fcntl(s,4,0x800);
          goto LAB_00106573;
        }
        close(s);
      }
      nVar1 = nhr_request_check_timeout(r);
      if (nVar1 == '\0') {
        return;
      }
    }
    if (s == -1) {
      nhr_thread_sleep(200);
      s = -1;
    }
  } while( true );
}

Assistant:

void nhr_request_connect_to_host(nhr_request r) {
	struct addrinfo * result = NULL;
	struct addrinfo * p = NULL;
	nhr_socket_t sock = NHR_INVALID_SOCKET;
	int retry_number = 0;
#if defined(NHR_OS_WINDOWS)
	unsigned long iMode = 0;
#endif

	r->last_time = time(NULL);
	result = nhr_request_connect_getaddr_info(r);
	if (!nhr_request_check_timeout(r)) {
		return; // error already exists
	}
	if (!result) {
		return; // error already exists
	}

	while ((++retry_number < NHR_CONNECT_ATTEMPS) && (sock == NHR_INVALID_SOCKET)) {
		for (p = result; p != NULL; p = p->ai_next) {
			r->last_time = time(NULL);
			sock = socket(p->ai_family, p->ai_socktype, p->ai_protocol);
			if (sock != NHR_INVALID_SOCKET) {
				nhr_request_set_option(sock, SO_ERROR, 1); // When an error occurs on a socket, set error variable so_error and notify process
				nhr_request_set_option(sock, SO_KEEPALIVE, 1); // Periodically test if connection is alive

				if (connect(sock, p->ai_addr, p->ai_addrlen) == 0) {
					r->socket = sock;
#if defined(NHR_OS_WINDOWS)
					iMode = 1; // If iMode != 0, non-blocking mode is enabled.
					ioctlsocket(r->socket, FIONBIO, &iMode);
#else
					fcntl(r->socket, F_SETFL, O_NONBLOCK);
#endif
					break;
				}
				NHR_SOCK_CLOSE(sock);
			}
			if (!nhr_request_check_timeout(r)) {
				return; // error already exists
			}
		}
		if (sock == NHR_INVALID_SOCKET) {
			nhr_thread_sleep(NHR_CONNECT_RETRY_DELAY);
		}
	}

	freeaddrinfo(result);

	if (r->socket == NHR_INVALID_SOCKET) {
#if defined(NHR_OS_WINDOWS)
		WSACleanup();
#endif
		r->error_code = nhr_error_code_failed_connect_to_host;
		nhr_request_set_command(r, NHR_COMMAND_INFORM_ERROR);
	} else {
		nhr_request_set_command(r, NHR_COMMAND_SEND_RAW_REQUEST);
	}
}